

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O3

void __thiscall glslang::TIntermediate::setSpv(TIntermediate *this,SpvVersion *s)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  iVar2 = s->vulkanGlsl;
  iVar3 = s->vulkan;
  iVar4 = s->openGl;
  (this->spvVersion).spv = s->spv;
  (this->spvVersion).vulkanGlsl = iVar2;
  (this->spvVersion).vulkan = iVar3;
  (this->spvVersion).openGl = iVar4;
  (this->spvVersion).vulkanRelaxed = s->vulkanRelaxed;
  if (0 < (this->spvVersion).vulkan) {
    TProcesses::addProcess(&this->processes,"client vulkan100");
  }
  if (0 < (this->spvVersion).openGl) {
    TProcesses::addProcess(&this->processes,"client opengl100");
  }
  uVar1 = (this->spvVersion).spv;
  if ((int)uVar1 < 0x10300) {
    if (0x100ff < (int)uVar1) {
      if (uVar1 == 0x10100) {
        pcVar5 = "target-env spirv1.1";
      }
      else {
        if (uVar1 != 0x10200) goto LAB_00350a81;
        pcVar5 = "target-env spirv1.2";
      }
      goto LAB_00350a88;
    }
    if ((uVar1 != 0) && (uVar1 != 0x10000)) {
LAB_00350a81:
      pcVar5 = "target-env spirvUnknown";
      goto LAB_00350a88;
    }
  }
  else {
    if ((int)uVar1 < 0x10500) {
      if (uVar1 == 0x10300) {
        pcVar5 = "target-env spirv1.3";
      }
      else {
        if (uVar1 != 0x10400) goto LAB_00350a81;
        pcVar5 = "target-env spirv1.4";
      }
    }
    else if (uVar1 == 0x10500) {
      pcVar5 = "target-env spirv1.5";
    }
    else {
      if (uVar1 != 0x10600) goto LAB_00350a81;
      pcVar5 = "target-env spirv1.6";
    }
LAB_00350a88:
    TProcesses::addProcess(&this->processes,pcVar5);
  }
  iVar2 = (this->spvVersion).vulkan;
  if (iVar2 < 0x402000) {
    if (iVar2 == 0) goto LAB_00350b05;
    if (iVar2 == 0x400000) {
      pcVar5 = "target-env vulkan1.0";
    }
    else if (iVar2 == 0x401000) {
      pcVar5 = "target-env vulkan1.1";
    }
    else {
LAB_00350ae0:
      pcVar5 = "target-env vulkanUnknown";
    }
  }
  else if (iVar2 == 0x402000) {
    pcVar5 = "target-env vulkan1.2";
  }
  else if (iVar2 == 0x403000) {
    pcVar5 = "target-env vulkan1.3";
  }
  else {
    if (iVar2 != 0x404000) goto LAB_00350ae0;
    pcVar5 = "target-env vulkan1.4";
  }
  TProcesses::addProcess(&this->processes,pcVar5);
LAB_00350b05:
  if ((this->spvVersion).openGl < 1) {
    return;
  }
  TProcesses::addProcess(&this->processes,"target-env opengl");
  return;
}

Assistant:

void setSpv(const SpvVersion& s)
    {
        spvVersion = s;

        // client processes
        if (spvVersion.vulkan > 0)
            processes.addProcess("client vulkan100");
        if (spvVersion.openGl > 0)
            processes.addProcess("client opengl100");

        // target SPV
        switch (spvVersion.spv) {
        case 0:
            break;
        case EShTargetSpv_1_0:
            break;
        case EShTargetSpv_1_1:
            processes.addProcess("target-env spirv1.1");
            break;
        case EShTargetSpv_1_2:
            processes.addProcess("target-env spirv1.2");
            break;
        case EShTargetSpv_1_3:
            processes.addProcess("target-env spirv1.3");
            break;
        case EShTargetSpv_1_4:
            processes.addProcess("target-env spirv1.4");
            break;
        case EShTargetSpv_1_5:
            processes.addProcess("target-env spirv1.5");
            break;
        case EShTargetSpv_1_6:
            processes.addProcess("target-env spirv1.6");
            break;
        default:
            processes.addProcess("target-env spirvUnknown");
            break;
        }

        // target-environment processes
        switch (spvVersion.vulkan) {
        case 0:
            break;
        case EShTargetVulkan_1_0:
            processes.addProcess("target-env vulkan1.0");
            break;
        case EShTargetVulkan_1_1:
            processes.addProcess("target-env vulkan1.1");
            break;
        case EShTargetVulkan_1_2:
            processes.addProcess("target-env vulkan1.2");
            break;
        case EShTargetVulkan_1_3:
            processes.addProcess("target-env vulkan1.3");
            break;
        case EShTargetVulkan_1_4:
            processes.addProcess("target-env vulkan1.4");
            break;
        default:
            processes.addProcess("target-env vulkanUnknown");
            break;
        }
        if (spvVersion.openGl > 0)
            processes.addProcess("target-env opengl");
    }